

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O3

int parse_register_name(Context_conflict *ctx,RegisterType *rtype,int *rnum)

{
  bool bVar1;
  RegisterType RVar2;
  uint in_EAX;
  Token TVar3;
  RegisterType RVar4;
  int extraout_EAX;
  int iVar5;
  RegisterType extraout_EAX_00;
  RegisterType extraout_EAX_01;
  RegisterType extraout_EAX_02;
  RegisterType RVar6;
  uint uVar7;
  uint32 ui32;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  TVar3 = nexttoken(ctx);
  if (TVar3 != TOKEN_IDENTIFIER) {
    failf(ctx,"%s","Expected register");
    return extraout_EAX;
  }
  RVar4 = check_token_segment(ctx,"oDepth");
  RVar6 = REG_TYPE_DEPTHOUT;
  uVar7 = 0;
  if (RVar4 != REG_TYPE_TEMP) goto LAB_00123dc9;
  RVar4 = check_token_segment(ctx,"vFace");
  RVar6 = REG_TYPE_MISCTYPE;
  RVar2 = REG_TYPE_MISCTYPE;
  if (RVar4 != REG_TYPE_TEMP) {
LAB_00123d70:
    RVar6 = RVar2;
    uVar7 = 1;
    goto LAB_00123dc9;
  }
  RVar4 = check_token_segment(ctx,"vPos");
  uVar7 = 0;
  if (RVar4 != REG_TYPE_TEMP) goto LAB_00123dc9;
  RVar4 = check_token_segment(ctx,"oPos");
  RVar6 = REG_TYPE_RASTOUT;
  uVar7 = 0;
  if (RVar4 != REG_TYPE_TEMP) goto LAB_00123dc9;
  RVar4 = check_token_segment(ctx,"oFog");
  RVar2 = RVar6;
  if (RVar4 != REG_TYPE_TEMP) goto LAB_00123d70;
  RVar4 = check_token_segment(ctx,"oPts");
  uVar7 = 2;
  if (RVar4 != REG_TYPE_TEMP) goto LAB_00123dc9;
  RVar4 = check_token_segment(ctx,"aL");
  RVar6 = REG_TYPE_LOOP;
  uVar7 = 0;
  if (RVar4 != REG_TYPE_TEMP) goto LAB_00123dc9;
  iVar5 = check_token_segment(ctx,"oC");
  if (iVar5 == 0) {
    iVar5 = check_token_segment(ctx,"oT");
    RVar4 = REG_TYPE_OUTPUT;
    if (iVar5 != 0) goto LAB_00123e62;
    iVar5 = check_token_segment(ctx,"oD");
    bVar1 = false;
    if (iVar5 == 0) {
      iVar5 = check_token_segment(ctx,"r");
      if (iVar5 == 0) {
        iVar5 = check_token_segment(ctx,"v");
        if (iVar5 == 0) {
          iVar5 = check_token_segment(ctx,"c");
          if (iVar5 != 0) {
            RVar6 = REG_TYPE_CONST;
            bVar1 = true;
            goto LAB_00123e65;
          }
          iVar5 = check_token_segment(ctx,"i");
          if (iVar5 == 0) {
            iVar5 = check_token_segment(ctx,"b");
            if (iVar5 == 0) {
              iVar5 = check_token_segment(ctx,"s");
              if (iVar5 == 0) {
                iVar5 = check_token_segment(ctx,"l");
                if (iVar5 == 0) {
                  iVar5 = check_token_segment(ctx,"p");
                  if (iVar5 == 0) {
                    iVar5 = check_token_segment(ctx,"o");
                    if (iVar5 == 0) {
                      iVar5 = check_token_segment(ctx,"a");
                      RVar6 = REG_TYPE_ADDRESS;
                      RVar4 = REG_TYPE_ADDRESS;
                      if (iVar5 == 0) {
                        iVar5 = check_token_segment(ctx,"t");
                        uVar7 = 0;
                        bVar1 = false;
                        if (iVar5 == 0) {
                          failf(ctx,"%s","expected register type");
                          RVar6 = REG_TYPE_CONST;
                          RVar4 = extraout_EAX_02;
                          goto LAB_00123dc9;
                        }
                        goto LAB_00123e65;
                      }
                    }
                  }
                  else {
                    RVar4 = REG_TYPE_MAX;
                  }
                }
                else {
                  RVar4 = REG_TYPE_LABEL;
                }
              }
              else {
                RVar4 = REG_TYPE_SAMPLER;
              }
            }
            else {
              RVar4 = REG_TYPE_CONSTBOOL;
            }
          }
          else {
            RVar4 = REG_TYPE_CONSTINT;
          }
        }
        else {
          RVar4 = REG_TYPE_INPUT;
        }
        goto LAB_00123e62;
      }
      RVar6 = REG_TYPE_TEMP;
    }
    else {
      RVar6 = REG_TYPE_ATTROUT;
    }
  }
  else {
    RVar4 = REG_TYPE_COLOROUT;
LAB_00123e62:
    RVar6 = RVar4;
    bVar1 = false;
  }
LAB_00123e65:
  if (ctx->tokenlen == 0) {
    TVar3 = nexttoken(ctx);
    if (ctx->pushedback != 0) {
      __assert_fail("!ctx->pushedback",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_assembler.c"
                    ,0x9f,"void pushback(Context *)");
    }
    ctx->pushedback = 1;
    ctx->tokenlen = 0;
    if (TVar3 == 0x5b) {
      RVar4 = REG_TYPE_CONST;
      if (bVar1) {
        RVar6 = RVar4;
      }
      uVar7 = 0;
      goto LAB_00123dc9;
    }
  }
  uStack_38 = (ulong)(uint)uStack_38;
  RVar4 = ui32fromtoken(ctx,(uint32 *)((long)&uStack_38 + 4));
  if (RVar4 == REG_TYPE_TEMP) {
    failf(ctx,"%s","Invalid register index");
    RVar4 = extraout_EAX_00;
  }
  uVar7 = uStack_38._4_4_;
  if ((bVar1) && (RVar6 = REG_TYPE_CONST, 0x7ff < (int)uStack_38._4_4_)) {
    if (uStack_38._4_4_ < 0x1000) {
      uVar7 = uStack_38._4_4_ - 0x800;
      RVar6 = REG_TYPE_CONST2;
    }
    else if (uStack_38._4_4_ < 0x1800) {
      uVar7 = uStack_38._4_4_ - 0x1000;
      RVar6 = REG_TYPE_CONST3;
    }
    else if (uStack_38._4_4_ < 0x2000) {
      uVar7 = uStack_38._4_4_ - 0x1800;
      RVar6 = REG_TYPE_CONST4;
    }
    else {
      failf(ctx,"%s","Invalid const register index");
      RVar4 = extraout_EAX_01;
    }
  }
LAB_00123dc9:
  *rtype = RVar6;
  *rnum = uVar7;
  return RVar4;
}

Assistant:

static int parse_register_name(Context *ctx, RegisterType *rtype, int *rnum)
{
    if (nexttoken(ctx) != TOKEN_IDENTIFIER)
    {
        fail(ctx, "Expected register");
        return 0;
    } // if

    int neednum = 1;
    int regnum = 0;
    RegisterType regtype = REG_TYPE_TEMP;

    // Watch out for substrings! oDepth must be checked before oD, since
    //  the latter will match either case.
    if (check_token_segment(ctx, "oDepth"))
    {
        regtype = REG_TYPE_DEPTHOUT;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "vFace"))
    {
        regtype = REG_TYPE_MISCTYPE;
        regnum = (int) MISCTYPE_TYPE_FACE;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "vPos"))
    {
        regtype = REG_TYPE_MISCTYPE;
        regnum = (int) MISCTYPE_TYPE_POSITION;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "oPos"))
    {
        regtype = REG_TYPE_RASTOUT;
        regnum = (int) RASTOUT_TYPE_POSITION;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "oFog"))
    {
        regtype = REG_TYPE_RASTOUT;
        regnum = (int) RASTOUT_TYPE_FOG;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "oPts"))
    {
        regtype = REG_TYPE_RASTOUT;
        regnum = (int) RASTOUT_TYPE_POINT_SIZE;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "aL"))
    {
        regtype = REG_TYPE_LOOP;
        neednum = 0;
    } // else if
    else if (check_token_segment(ctx, "oC"))
        regtype = REG_TYPE_COLOROUT;
    else if (check_token_segment(ctx, "oT"))
        regtype = REG_TYPE_OUTPUT;
    else if (check_token_segment(ctx, "oD"))
        regtype = REG_TYPE_ATTROUT;
    else if (check_token_segment(ctx, "r"))
        regtype = REG_TYPE_TEMP;
    else if (check_token_segment(ctx, "v"))
        regtype = REG_TYPE_INPUT;
    else if (check_token_segment(ctx, "c"))
        regtype = REG_TYPE_CONST;
    else if (check_token_segment(ctx, "i"))
        regtype = REG_TYPE_CONSTINT;
    else if (check_token_segment(ctx, "b"))
        regtype = REG_TYPE_CONSTBOOL;
    else if (check_token_segment(ctx, "s"))
        regtype = REG_TYPE_SAMPLER;
    else if (check_token_segment(ctx, "l"))
        regtype = REG_TYPE_LABEL;
    else if (check_token_segment(ctx, "p"))
        regtype = REG_TYPE_PREDICATE;
    else if (check_token_segment(ctx, "o"))
        regtype = REG_TYPE_OUTPUT;
    else if (check_token_segment(ctx, "a"))
        regtype = REG_TYPE_ADDRESS;
    else if (check_token_segment(ctx, "t"))
        regtype = REG_TYPE_ADDRESS;
        
    //case REG_TYPE_TEMPFLOAT16:  // !!! FIXME: don't know this asm string

    else
    {
        fail(ctx, "expected register type");
        regtype = REG_TYPE_CONST;
        regnum = 0;
        neednum = 0;
    } // else

    // "c[5]" is the same as "c5", so if the token is done, see if next is '['.
    if ((neednum) && (ctx->tokenlen == 0))
    {
        const int tlen = ctx->tokenlen;  // we need to protect this for later.
        if (nexttoken(ctx) == ((Token) '['))
            neednum = 0;  // don't need a number on register name itself.
        pushback(ctx);
        ctx->tokenlen = tlen;
    } // if

    if (neednum)
    {
        uint32 ui32 = 0;
        if (!ui32fromtoken(ctx, &ui32))
            fail(ctx, "Invalid register index");
        regnum = (int) ui32;
    } // if

    // split up REG_TYPE_CONST
    if (regtype == REG_TYPE_CONST)
    {
        if (regnum < 2048)
        {
            regtype = REG_TYPE_CONST;
            regnum -= 0;
        } // if
        else if (regnum < 4096)
        {
            regtype = REG_TYPE_CONST2;
            regnum -= 2048;
        } // if
        else if (regnum < 6144)
        {
            regtype = REG_TYPE_CONST3;
            regnum -= 4096;
        } // if
        else if (regnum < 8192)
        {
            regtype = REG_TYPE_CONST4;
            regnum -= 6144;
        } // if
        else
        {
            fail(ctx, "Invalid const register index");
        } // else
    } // if

    *rtype = regtype;
    *rnum = regnum;

    return 1;
}